

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttcmap.c
# Opt level: O2

FT_UInt32 tt_cmap10_char_next(TT_CMap cmap,FT_UInt32 *pchar_code)

{
  FT_Byte *pFVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  ushort *puVar5;
  ushort uVar6;
  
  if (*pchar_code == 0xffffffff) {
    return 0;
  }
  pFVar1 = cmap->data;
  uVar2 = *(uint *)(pFVar1 + 0x10);
  uVar3 = *(uint *)(pFVar1 + 0xc);
  uVar4 = uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18;
  uVar3 = *pchar_code + 1;
  if (uVar3 <= uVar4) {
    uVar3 = uVar4;
  }
  puVar5 = (ushort *)(pFVar1 + (ulong)((uVar3 - uVar4) * 2) + 0x14);
  do {
    if ((uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18) <=
        uVar3 - uVar4) {
      uVar2 = 0;
LAB_002036a8:
      *pchar_code = uVar3;
      return uVar2;
    }
    uVar6 = *puVar5 << 8 | *puVar5 >> 8;
    if (uVar6 != 0) {
      uVar2 = (uint)uVar6;
      goto LAB_002036a8;
    }
    uVar3 = uVar3 + 1;
    if (uVar3 == 0) {
      return 0;
    }
    puVar5 = puVar5 + 1;
  } while( true );
}

Assistant:

FT_CALLBACK_DEF( FT_UInt32 )
  tt_cmap10_char_next( TT_CMap     cmap,
                       FT_UInt32  *pchar_code )
  {
    FT_Byte*   table     = cmap->data;
    FT_UInt32  char_code;
    FT_UInt    gindex    = 0;
    FT_Byte*   p         = table + 12;
    FT_UInt32  start     = TT_NEXT_ULONG( p );
    FT_UInt32  count     = TT_NEXT_ULONG( p );
    FT_UInt32  idx;


    if ( *pchar_code >= 0xFFFFFFFFUL )
      return 0;

    char_code = *pchar_code + 1;

    if ( char_code < start )
      char_code = start;

    idx = char_code - start;
    p  += 2 * idx;

    for ( ; idx < count; idx++ )
    {
      gindex = TT_NEXT_USHORT( p );
      if ( gindex != 0 )
        break;

      if ( char_code >= 0xFFFFFFFFUL )
        return 0;

      char_code++;
    }

    *pchar_code = char_code;
    return gindex;
  }